

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  byte bVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_001d1ea9;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
        bVar2 = pEVar1->field_0xa;
        goto LAB_001d1e8f;
      }
      goto LAB_001d1ec1;
    }
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      SetEnum((ExtensionSet *)&stack0xffffffffffffffd8);
LAB_001d1ea9:
      SetEnum((ExtensionSet *)&stack0xffffffffffffffd8);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 8) {
      pEVar1->is_repeated = false;
      bVar2 = pEVar1->field_0xa & 0xfe;
LAB_001d1e8f:
      pEVar1->field_0xa = bVar2 & 0xfd;
      (pEVar1->field_0).enum_value = value;
      return;
    }
    SetEnum();
  }
  SetEnum((ExtensionSet *)&stack0xffffffffffffffd8);
LAB_001d1ec1:
  SetEnum();
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}